

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  ostream_type *local_38;
  char *pcStack_30;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_20;
  
  local_38 = it->_M_stream;
  pcStack_30 = it->_M_string;
  internal::
  format_decimal<char,std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long>
            (&local_20,(unsigned_long)&local_38,(int)*(undefined8 *)this);
  it->_M_stream = local_20._M_stream;
  it->_M_string = local_20._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }